

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-select.c
# Opt level: O0

ssh_hash * sha512_select(ssh_hashalg *alg)

{
  void *pvVar1;
  ssh_hashalg *alg_00;
  _Bool _Var2;
  ssh_hash *psVar3;
  sha512_extra *alg_extra;
  ssh_hashalg *alg_1;
  size_t i;
  ssh_hashalg **real_algs;
  ssh_hashalg *alg_local;
  
  pvVar1 = alg->extra;
  alg_1 = (ssh_hashalg *)0x0;
  while( true ) {
    if (*(long *)((long)pvVar1 + (long)alg_1 * 8) == 0) {
      __assert_fail("false && \"sha512_select ran off the end of its list\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/sha512-select.c"
                    ,0x2c,"ssh_hash *sha512_select(const ssh_hashalg *)");
    }
    alg_00 = *(ssh_hashalg **)((long)pvVar1 + (long)alg_1 * 8);
    _Var2 = check_availability((sha512_extra *)alg_00->extra);
    if (_Var2) break;
    alg_1 = (ssh_hashalg *)((long)&alg_1->new + 1);
  }
  psVar3 = ssh_hash_new(alg_00);
  return psVar3;
}

Assistant:

static ssh_hash *sha512_select(const ssh_hashalg *alg)
{
    const ssh_hashalg *const *real_algs =
        (const ssh_hashalg *const *)alg->extra;

    for (size_t i = 0; real_algs[i]; i++) {
        const ssh_hashalg *alg = real_algs[i];
        const struct sha512_extra *alg_extra =
            (const struct sha512_extra *)alg->extra;
        if (check_availability(alg_extra))
            return ssh_hash_new(alg);
    }

    /* We should never reach the NULL at the end of the list, because
     * the last non-NULL entry should be software-only SHA-512, which
     * is always available. */
    unreachable("sha512_select ran off the end of its list");
}